

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

char * GetOpName(SynModifyAssignType type)

{
  char *pcStack_10;
  SynModifyAssignType type_local;
  
  switch(type) {
  case SYN_MODIFY_ASSIGN_ADD:
    pcStack_10 = "+=";
    break;
  case SYN_MODIFY_ASSIGN_SUB:
    pcStack_10 = "-=";
    break;
  case SYN_MODIFY_ASSIGN_MUL:
    pcStack_10 = "*=";
    break;
  case SYN_MODIFY_ASSIGN_DIV:
    pcStack_10 = "/=";
    break;
  case SYN_MODIFY_ASSIGN_POW:
    pcStack_10 = "**=";
    break;
  case SYN_MODIFY_ASSIGN_MOD:
    pcStack_10 = "%=";
    break;
  case SYN_MODIFY_ASSIGN_SHL:
    pcStack_10 = "<<=";
    break;
  case SYN_MODIFY_ASSIGN_SHR:
    pcStack_10 = ">>=";
    break;
  case SYN_MODIFY_ASSIGN_BIT_AND:
    pcStack_10 = "&=";
    break;
  case SYN_MODIFY_ASSIGN_BIT_OR:
    pcStack_10 = "|=";
    break;
  case SYN_MODIFY_ASSIGN_BIT_XOR:
    pcStack_10 = "^=";
    break;
  default:
    __assert_fail("!\"unknown operation type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                  ,0xef0,"const char *GetOpName(SynModifyAssignType)");
  }
  return pcStack_10;
}

Assistant:

const char* GetOpName(SynModifyAssignType type)
{
	switch(type)
	{
	case SYN_MODIFY_ASSIGN_ADD:
		return "+=";
	case SYN_MODIFY_ASSIGN_SUB:
		return "-=";
	case SYN_MODIFY_ASSIGN_MUL:
		return "*=";
	case SYN_MODIFY_ASSIGN_DIV:
		return "/=";
	case SYN_MODIFY_ASSIGN_POW:
		return "**=";
	case SYN_MODIFY_ASSIGN_MOD:
		return "%=";
	case SYN_MODIFY_ASSIGN_SHL:
		return "<<=";
	case SYN_MODIFY_ASSIGN_SHR:
		return ">>=";
	case SYN_MODIFY_ASSIGN_BIT_AND:
		return "&=";
	case SYN_MODIFY_ASSIGN_BIT_OR:
		return "|=";
	case SYN_MODIFY_ASSIGN_BIT_XOR:
		return "^=";
	default:
		break;
	}

	assert(!"unknown operation type");
	return "";
}